

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O1

void __thiscall
asmjit::ZoneStackBase::_cleanupBlock(ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  ulong *puVar1;
  Block *pBVar2;
  ZoneAllocator *pZVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  sbyte sVar6;
  Error EVar7;
  CodeHolder *pCVar9;
  char cVar10;
  sbyte sVar11;
  ulong uVar12;
  uint extraout_EDX;
  uint sizeOfT;
  uint extraout_EDX_00;
  void *pvVar13;
  long *extraout_RDX;
  long *plVar14;
  long lVar15;
  uint uVar16;
  CodeHolder *unaff_RBX;
  uint uVar18;
  ulong uVar19;
  undefined4 in_register_00000034;
  CodeHolder *pCVar20;
  CodeHolder *pCVar21;
  CodeHolder *pCVar22;
  CodeHolder *pCVar23;
  long lVar24;
  CodeHolder *unaff_R13;
  CodeHolder *pCVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uStack_10c;
  CodeHolder *pCStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  CodeHolder *pCStack_e8;
  CodeHolder *pCStack_e0;
  CodeHolder *pCStack_d8;
  CodeHolder *pCStack_d0;
  code *pcStack_c8;
  ulong uStack_c0;
  long *plStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  CodeHolder *pCStack_a0;
  CodeHolder *pCStack_98;
  CodeHolder *pCStack_90;
  ulong uStack_88;
  ulong uStack_80;
  CodeHolder *pCStack_70;
  CodeHolder *pCStack_68;
  ulong uStack_60;
  ulong uStack_58;
  CodeHolder *pCStack_48;
  ulong uStack_40;
  uint uVar8;
  ulong uVar17;
  
  pCVar20 = (CodeHolder *)CONCAT44(in_register_00000034,side);
  uVar26 = (ulong)side;
  pBVar2 = this->_block[uVar26];
  pCVar9 = (CodeHolder *)pBVar2->_start;
  if (pCVar9 == (CodeHolder *)pBVar2->_end) {
    pCVar9 = (CodeHolder *)(ulong)(side == 0);
    pCVar20 = (CodeHolder *)pBVar2->_link[(long)pCVar9];
    if (pCVar20 == (CodeHolder *)0x0) {
      if (this->_block[(long)pCVar9] == pBVar2) {
        pvVar13 = (void *)((long)pBVar2->_link + middleIndex);
        pBVar2->_start = pvVar13;
        pBVar2->_end = pvVar13;
      }
      return;
    }
    if (*(Block **)((long)&pCVar20->_allocator + uVar26 * 8 + 0xffffffffffffffc0) != pBVar2)
    goto LAB_001254d1;
    pZVar3 = this->_allocator;
    if (pZVar3->_zone == (Zone *)0x0) goto LAB_001254d6;
    if (pBVar2 != (Block *)0x0) {
      pBVar2->_link[0] = (Block *)pZVar3->_slots[9];
      pZVar3->_slots[9] = (Slot *)pBVar2;
      *(undefined8 *)((long)&pCVar20->_allocator + uVar26 * 8 + 0xffffffffffffffc0) = 0;
      this->_block[uVar26] = (Block *)pCVar20;
      return;
    }
  }
  else {
    _cleanupBlock();
LAB_001254d1:
    _cleanupBlock();
LAB_001254d6:
    _cleanupBlock();
  }
  _cleanupBlock();
  uVar8 = *(uint *)((long)&((CodeHolder *)this)->_baseAddress + 4);
  uVar26 = (ulong)uVar8;
  uVar18 = 0;
  if (side <= uVar8) {
    return;
  }
  pCVar22 = (CodeHolder *)(ulong)extraout_EDX;
  if (side * extraout_EDX < side) {
    return;
  }
  if (*(long *)&pCVar20->_environment == 0) {
    uStack_58 = 0x125632;
    pCVar21 = pCVar20;
    ZoneVectorBase::_reserve();
    pCVar23 = (CodeHolder *)this;
LAB_00125632:
    uStack_58 = 0x125637;
    ZoneVectorBase::_reserve();
LAB_00125637:
    uStack_58 = 0x12563c;
    ZoneVectorBase::_reserve();
  }
  else {
    uStack_58 = 0x12552e;
    uVar18 = 0;
    pCVar9 = (CodeHolder *)
             ZoneAllocator::_alloc((ZoneAllocator *)pCVar20,(ulong)(side * extraout_EDX),&uStack_40)
    ;
    if (pCVar9 == (CodeHolder *)0x0) {
      return;
    }
    pCVar21 = *(CodeHolder **)&((CodeHolder *)this)->_environment;
    pCVar23 = pCVar22;
    if ((ulong)*(uint *)&((CodeHolder *)this)->_baseAddress != 0) {
      uStack_58 = 0x125562;
      pCStack_48 = pCVar22;
      memcpy(pCVar9,pCVar21,(ulong)*(uint *)&((CodeHolder *)this)->_baseAddress * (long)pCVar22);
      pCVar23 = pCStack_48;
      pCVar22 = pCVar9;
      unaff_R13 = pCVar20;
    }
    unaff_RBX = (CodeHolder *)this;
    if (pCVar21 == (CodeHolder *)0x0) {
LAB_001255ff:
      uVar18 = 0;
      uVar8 = (uint)(uStack_40 / (ulong)pCVar23);
      *(uint *)((long)&((CodeHolder *)this)->_baseAddress + 4) = uVar8;
      if (side <= uVar8) {
        ((CodeHolder *)this)->_environment = (Environment)pCVar9;
        return;
      }
      goto LAB_00125632;
    }
    if (*(long *)&pCVar20->_environment == 0) goto LAB_00125637;
    uVar26 = uVar26 * (long)pCVar23;
    if (uVar26 != 0) {
      if (uVar26 < 0x201) {
        if (uVar26 < 0x81) {
          uVar8 = (uint)(uVar26 + 0x1fffffffff >> 5);
        }
        else {
          uVar8 = (int)(uVar26 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar8 = 0;
      }
      if (uVar26 < 0x201) {
        pCVar21->_environment =
             (Environment)
             *(undefined8 *)((long)&pCVar20->_allocator + (ulong)uVar8 * 8 + 0xffffffffffffffc8);
        *(CodeHolder **)((long)&pCVar20->_allocator + (ulong)uVar8 * 8 + 0xffffffffffffffc8) =
             pCVar21;
      }
      else {
        uStack_58 = 0x1255f9;
        ZoneAllocator::_releaseDynamic((ZoneAllocator *)pCVar20,pCVar21,uVar26);
        pCVar22 = pCVar9;
        unaff_R13 = pCVar23;
      }
      goto LAB_001255ff;
    }
  }
  uStack_58 = 0x125641;
  ZoneVectorBase::_reserve();
  uVar12 = (ulong)sizeOfT;
  uVar8 = *(uint *)&pCVar23->_baseAddress;
  uStack_88 = (ulong)uVar8;
  pCStack_70 = unaff_RBX;
  pCStack_68 = pCVar20;
  uStack_60 = uVar26;
  uStack_58 = (ulong)side;
  if (uVar18 <= *(uint *)((long)&pCVar23->_baseAddress + 4)) {
LAB_00125659:
    if (uVar8 < uVar18) {
      uStack_80 = 0x12567a;
      memset((void *)(uStack_88 * uVar12 + *(long *)&pCVar23->_environment),0,
             (uVar18 - uVar8) * uVar12);
    }
    *(uint *)&pCVar23->_baseAddress = uVar18;
    return;
  }
  uVar26 = (ulong)(uVar18 - uVar8);
  uStack_80 = 0x12569a;
  pCVar20 = pCVar23;
  EVar7 = ZoneVectorBase::_grow
                    ((ZoneVectorBase *)pCVar23,(ZoneAllocator *)pCVar21,sizeOfT,uVar18 - uVar8);
  if (EVar7 != 0) {
    return;
  }
  if (uVar18 <= *(uint *)((long)&pCVar23->_baseAddress + 4)) goto LAB_00125659;
  uStack_80 = 0x1256a9;
  ZoneVectorBase::_resize();
  uVar8 = *(uint *)(extraout_RDX + 1);
  uVar19 = (ulong)uVar8;
  if (uVar8 == 0) {
    *(undefined4 *)&pCVar20->_baseAddress = 0;
    return;
  }
  pCVar25 = *(CodeHolder **)&pCVar20->_environment;
  plVar14 = extraout_RDX;
  if (uVar8 <= *(uint *)((long)&pCVar20->_baseAddress + 4)) goto LAB_0012573f;
  uVar16 = uVar8 + 0x3f & 0xffffffc0;
  uVar17 = (ulong)uVar16;
  if (uVar16 < uVar8) {
    cVar10 = '\0';
    plStack_b8 = extraout_RDX;
  }
  else {
    uStack_a8 = (ulong)uVar18;
    pCStack_a0 = pCVar22;
    pCStack_98 = unaff_R13;
    pCStack_90 = pCVar23;
    uStack_80 = uVar12;
    if (*(long *)&pCVar21->_environment == 0) {
      pcStack_c8 = (code *)0x1257bf;
      pCVar22 = pCVar21;
      pCVar23 = pCVar20;
      ZoneBitVector::copyFrom();
LAB_001257bf:
      uVar12 = uVar17;
LAB_00125722:
      uVar18 = (uint)uVar26;
      if (pCVar25 != (CodeHolder *)0x0) {
        if (*(long *)&pCVar21->_environment == 0) {
          pcStack_c8 = (code *)0x1257cb;
          ZoneBitVector::copyFrom();
        }
        else {
          uVar16 = *(uint *)((long)&pCVar20->_baseAddress + 4);
          pCVar23 = (CodeHolder *)(ulong)uVar16;
          uStack_c0 = uVar12;
          if (7 < uVar16) {
            uVar26 = uVar26 & 0xffffffff;
            pcStack_c8 = (code *)0x1257a8;
            ZoneBitVector::copyFrom();
            uVar12 = uStack_c0;
            goto LAB_00125727;
          }
        }
        pcStack_c8 = ZoneBitVector::_resize;
        ZoneBitVector::copyFrom();
        uStack_f0 = uVar17;
        pCStack_e8 = pCVar21;
        pCStack_e0 = unaff_R13;
        pCStack_d8 = pCVar25;
        pCStack_d0 = pCVar20;
        pcStack_c8 = (code *)uVar19;
        if (extraout_EDX_00 <= uVar18) {
          uVar17 = (ulong)extraout_EDX_00;
          uVar8 = *(uint *)&pCVar23->_baseAddress;
          pCVar21 = (CodeHolder *)(ulong)uVar8;
          if (extraout_EDX_00 <= uVar8) {
            if ((extraout_EDX_00 & 0x3f) != 0) {
              puVar1 = (ulong *)(*(long *)&pCVar23->_environment + (ulong)(extraout_EDX_00 >> 6) * 8
                                );
              *puVar1 = *puVar1 & ~(-1L << (sbyte)(extraout_EDX_00 & 0x3f));
            }
            goto LAB_001259dc;
          }
          pCVar20 = *(CodeHolder **)&pCVar23->_environment;
          if (extraout_EDX_00 <= *(uint *)((long)&pCVar23->_baseAddress + 4)) goto LAB_001258a6;
          uVar18 = uVar18 + 0x3f & 0xffffffc0;
          if (uVar18 < extraout_EDX_00) goto LAB_00125a2a;
          if (pCVar22->_environment != (Environment)0x0) {
            uStack_10c = (uint)pCVar9;
            pCVar9 = pCVar22;
            unaff_R13 = (CodeHolder *)
                        ZoneAllocator::_alloc
                                  ((ZoneAllocator *)pCVar22,(ulong)(uVar18 >> 3),&uStack_f8);
            pCVar9 = (CodeHolder *)
                     CONCAT71((int7)((ulong)pCVar9 >> 8),unaff_R13 != (CodeHolder *)0x0);
            if (unaff_R13 != (CodeHolder *)0x0) {
              uVar26 = uStack_f8 * 8;
              pCStack_100 = pCVar22;
              if (uVar26 < uStack_f8) goto LAB_00125a36;
              goto LAB_00125860;
            }
LAB_00125893:
            cVar10 = (char)pCVar9;
            pCVar9 = (CodeHolder *)(ulong)uStack_10c;
            goto LAB_00125898;
          }
          pCVar9 = pCVar23;
          ZoneBitVector::_resize();
LAB_00125a36:
          uVar26 = (ulong)uVar18;
LAB_00125860:
          if (0x3f < uVar8 + 0x3f) {
            uVar12 = 0;
            do {
              *(long *)((long)&unaff_R13->_allocator + uVar12 * 8 + 0xffffffffffffffc0) =
                   *(long *)((long)&pCVar20->_allocator + uVar12 * 8 + 0xffffffffffffffc0);
              uVar12 = uVar12 + 1;
            } while (uVar8 + 0x3f >> 6 != uVar12);
          }
          if (pCVar20 == (CodeHolder *)0x0) {
LAB_00125889:
            pCVar23->_environment = (Environment)unaff_R13;
            *(int *)((long)&pCVar23->_baseAddress + 4) = (int)uVar26;
            pCVar20 = unaff_R13;
            goto LAB_00125893;
          }
          pCVar22 = pCVar9;
          if (pCStack_100->_environment != (Environment)0x0) {
            uVar8 = *(uint *)((long)&pCVar23->_baseAddress + 4);
            pCVar22 = (CodeHolder *)(ulong)uVar8;
            if (uVar8 < 8) goto LAB_00125a48;
            ZoneBitVector::_resize();
            pCVar9 = (CodeHolder *)((ulong)pCVar9 & 0xffffffff);
            goto LAB_00125889;
          }
LAB_00125a43:
          ZoneBitVector::_resize();
LAB_00125a48:
          ZoneBitVector::_resize();
          BaseAssembler::BaseAssembler((BaseAssembler *)pCVar22);
          pCVar22->_environment = (Environment)&PTR__Assembler_00159938;
          if (pCStack_100 != (CodeHolder *)0x0) {
            CodeHolder::attach(pCStack_100,(BaseEmitter *)pCVar22);
            return;
          }
          return;
        }
        ZoneBitVector::_resize();
        pCVar23 = pCVar25;
LAB_00125a2a:
        cVar10 = '\0';
LAB_00125898:
        if (cVar10 == '\0') {
          return;
        }
LAB_001258a6:
        pCVar22 = (CodeHolder *)((ulong)pCVar21 >> 6 & 0x3ffffff);
        uVar18 = (uint)pCVar22;
        uVar8 = (uint)uVar17 & 0x3f;
        sVar6 = (sbyte)uVar8;
        lVar15 = -((ulong)pCVar9 & 0xff);
        uVar16 = (uint)pCVar21 & 0x3f;
        if (((ulong)pCVar21 & 0x3f) != 0) {
          pCStack_100 = (CodeHolder *)(uVar17 >> 6);
          sVar11 = 0;
          if ((uVar18 == (uint)pCStack_100) && (sVar11 = sVar6, uVar8 <= uVar16)) {
            ZoneBitVector::_resize();
            goto LAB_00125a43;
          }
          puVar1 = (ulong *)((long)&pCVar20->_allocator + (long)pCVar22 * 8 + 0xffffffffffffffc0U);
          *puVar1 = *puVar1 | lVar15 << (sVar11 - (char)uVar16 & 0x3fU);
          uVar18 = uVar18 + 1;
        }
        auVar5 = _DAT_0013ba60;
        auVar4 = _DAT_0013ba50;
        uVar8 = (uint)uVar17 + 0x3f >> 6;
        if (uVar18 < uVar8) {
          uVar26 = (ulong)uVar18;
          lVar24 = (uVar8 - uVar26) + -1;
          auVar27._8_4_ = (int)lVar24;
          auVar27._0_8_ = lVar24;
          auVar27._12_4_ = (int)((ulong)lVar24 >> 0x20);
          uVar12 = 0;
          auVar27 = auVar27 ^ _DAT_0013ba60;
          do {
            auVar28._8_4_ = (int)uVar12;
            auVar28._0_8_ = uVar12;
            auVar28._12_4_ = (int)(uVar12 >> 0x20);
            auVar28 = (auVar28 | auVar4) ^ auVar5;
            if ((bool)(~(auVar28._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar28._0_4_ ||
                        auVar27._4_4_ < auVar28._4_4_) & 1)) {
              *(long *)((long)&pCVar20->_allocator + uVar12 * 8 + uVar26 * 8 + 0xffffffffffffffc0) =
                   lVar15;
            }
            if ((auVar28._12_4_ != auVar27._12_4_ || auVar28._8_4_ <= auVar27._8_4_) &&
                auVar28._12_4_ <= auVar27._12_4_) {
              *(long *)((long)&pCVar20->_allocator + uVar12 * 8 + uVar26 * 8 + 0xffffffffffffffc8) =
                   lVar15;
            }
            uVar12 = uVar12 + 2;
          } while (((uVar8 - uVar26) + 1 & 0xfffffffffffffffe) != uVar12);
        }
        if ((uVar17 & 0x3f) != 0) {
          uVar26 = 0;
          if ((char)pCVar9 != '\0') {
            uVar26 = ~(-1L << sVar6);
          }
          *(ulong *)((long)&pCVar20->_allocator + (ulong)(uVar8 - 1) * 8 + 0xffffffffffffffc0) =
               uVar26;
        }
LAB_001259dc:
        *(int *)&pCVar23->_baseAddress = (int)uVar17;
        return;
      }
LAB_00125727:
      pCVar20->_environment = (Environment)unaff_R13;
      *(int *)((long)&pCVar20->_baseAddress + 4) = (int)uVar12;
      pCVar25 = unaff_R13;
    }
    else {
      pCVar22 = (CodeHolder *)(ulong)(uVar16 >> 3);
      pcStack_c8 = (code *)0x125701;
      pCVar23 = pCVar21;
      plStack_b8 = extraout_RDX;
      unaff_R13 = (CodeHolder *)
                  ZoneAllocator::_alloc((ZoneAllocator *)pCVar21,(size_t)pCVar22,&uStack_b0);
      uVar26 = CONCAT71((int7)(uVar26 >> 8),unaff_R13 != (CodeHolder *)0x0);
      if (unaff_R13 != (CodeHolder *)0x0) {
        uVar12 = uStack_b0 * 8;
        if (uStack_b0 * 8 < uStack_b0) goto LAB_001257bf;
        goto LAB_00125722;
      }
    }
    cVar10 = (char)uVar26;
  }
  plVar14 = plStack_b8;
  if (cVar10 == '\0') {
    return;
  }
LAB_0012573f:
  *(uint *)&pCVar20->_baseAddress = uVar8;
  if (0x3f < uVar8 + 0x3f) {
    lVar15 = *plVar14;
    uVar26 = 0;
    do {
      *(long *)((long)&pCVar25->_allocator + uVar26 * 8 + 0xffffffffffffffc0) =
           *(long *)(lVar15 + uVar26 * 8);
      uVar26 = uVar26 + 1;
    } while (uVar8 + 0x3f >> 6 != uVar26);
  }
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}